

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_gost2015.c
# Opt level: O0

void gost_mgm128_init(mgm128_context *ctx,void *key,block128_f block,mul128_f mul_gf,int blen)

{
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  void *in_RDI;
  undefined4 in_R8D;
  
  memset(in_RDI,0,200);
  *(undefined8 *)((long)in_RDI + 0xa8) = in_RDX;
  *(undefined8 *)((long)in_RDI + 0xb0) = in_RCX;
  *(undefined8 *)((long)in_RDI + 0xc0) = in_RSI;
  *(undefined4 *)((long)in_RDI + 0xb8) = in_R8D;
  return;
}

Assistant:

void gost_mgm128_init(mgm128_context *ctx, void *key, block128_f block, mul128_f mul_gf, int blen)
{
    memset(ctx, 0, sizeof(*ctx));
    ctx->block = block;
    ctx->mul_gf = mul_gf;
    ctx->key = key;
    ctx->blocklen = blen;

    /* some precalculations place here
     *
     */
}